

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_files.c
# Opt level: O0

ngx_int_t ngx_create_file_mapping(ngx_file_mapping_t *fm)

{
  ngx_log_t *pnVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  ngx_file_mapping_t *fm_local;
  
  iVar2 = open64((char *)fm->name,0x242,0x1a4);
  fm->fd = iVar2;
  if (fm->fd == -1) {
    if (2 < fm->log->log_level) {
      pnVar1 = fm->log;
      piVar3 = __errno_location();
      ngx_log_error_core(3,pnVar1,*piVar3,"open() \"%s\" failed",fm->name);
    }
  }
  else {
    iVar2 = ftruncate64(fm->fd,fm->size);
    if (iVar2 == -1) {
      if (2 < fm->log->log_level) {
        pnVar1 = fm->log;
        piVar3 = __errno_location();
        ngx_log_error_core(3,pnVar1,*piVar3,"ftruncate() \"%s\" failed",fm->name);
      }
    }
    else {
      pvVar4 = mmap64((void *)0x0,fm->size,3,1,fm->fd,0);
      fm->addr = pvVar4;
      if (fm->addr != (void *)0xffffffffffffffff) {
        return 0;
      }
      if (2 < fm->log->log_level) {
        pnVar1 = fm->log;
        piVar3 = __errno_location();
        ngx_log_error_core(3,pnVar1,*piVar3,"mmap(%uz) \"%s\" failed",fm->size,fm->name);
      }
    }
    iVar2 = close(fm->fd);
    if ((iVar2 == -1) && (1 < fm->log->log_level)) {
      pnVar1 = fm->log;
      piVar3 = __errno_location();
      ngx_log_error_core(2,pnVar1,*piVar3,"close() \"%s\" failed",fm->name);
    }
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_create_file_mapping(ngx_file_mapping_t *fm)
{
    fm->fd = ngx_open_file(fm->name, NGX_FILE_RDWR, NGX_FILE_TRUNCATE,
                           NGX_FILE_DEFAULT_ACCESS);
    if (fm->fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", fm->name);
        return NGX_ERROR;
    }

    if (ftruncate(fm->fd, fm->size) == -1) {
        ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                      "ftruncate() \"%s\" failed", fm->name);
        goto failed;
    }

    fm->addr = mmap(NULL, fm->size, PROT_READ|PROT_WRITE, MAP_SHARED,
                    fm->fd, 0);
    if (fm->addr != MAP_FAILED) {
        return NGX_OK;
    }

    ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                  "mmap(%uz) \"%s\" failed", fm->size, fm->name);

failed:

    if (ngx_close_file(fm->fd) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, fm->log, ngx_errno,
                      ngx_close_file_n " \"%s\" failed", fm->name);
    }

    return NGX_ERROR;
}